

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O2

int each_character(ALLEGRO_FONT *f,ALLEGRO_COLOR color,ALLEGRO_USTR *text,float x,float y,
                  ALLEGRO_GLYPH *glyph,
                  _func_int_ALLEGRO_FONT_ptr_ALLEGRO_COLOR_int_float_float_ALLEGRO_GLYPH_ptr *cb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int c;
  int iVar3;
  BMFONT_CHAR *prev;
  int iVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ALLEGRO_COLOR AVar5;
  int pos;
  undefined4 local_6c;
  BMFONT_DATA *local_68;
  _func_int_ALLEGRO_FONT_ptr_ALLEGRO_COLOR_int_float_float_ALLEGRO_GLYPH_ptr *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_68 = (BMFONT_DATA *)f->data;
  local_6c = 0;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = color._8_8_;
  local_48._12_4_ = in_XMM1_Dd;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = color._0_8_;
  local_58._12_4_ = in_XMM0_Dd;
  iVar4 = 0;
  iVar3 = 0;
  local_60 = cb;
  while( true ) {
    c = al_ustr_get_next(text,&local_6c);
    if (c < 0) break;
    if (iVar3 != 0) {
      prev = find_codepoint(local_68,iVar3);
      iVar3 = get_kerning(prev,c);
      iVar4 = iVar4 + iVar3;
    }
    auVar2 = local_48;
    auVar1 = local_58;
    AVar5.b = (float)local_48._0_4_;
    AVar5.a = (float)local_48._4_4_;
    AVar5.r = (float)local_58._0_4_;
    AVar5.g = (float)local_58._4_4_;
    local_58 = auVar1;
    local_48 = auVar2;
    iVar3 = (*local_60)(f,AVar5,c,(float)iVar4 + x,y,glyph);
    iVar4 = iVar4 + iVar3;
    iVar3 = c;
  }
  return iVar4;
}

Assistant:

static int each_character(const ALLEGRO_FONT *f, ALLEGRO_COLOR color,
      const ALLEGRO_USTR *text, float x, float y, ALLEGRO_GLYPH *glyph,
      int (*cb)(const ALLEGRO_FONT *f, ALLEGRO_COLOR color, int ch,
      float x, float y, ALLEGRO_GLYPH *glyph)) {
   BMFONT_DATA *data = f->data;
   int pos = 0;
   int advance = 0;
   int prev = 0;
   while (true) {
      int c = al_ustr_get_next(text, &pos);
      if (c < 0) break;
      if (prev) {
         BMFONT_CHAR *pc = find_codepoint(data, prev);
         advance += get_kerning(pc, c);
      }
      advance += cb(f, color, c, x + advance, y, glyph);
      prev = c;
   }
   return advance;
}